

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcknowledgeReliablePdu.cpp
# Opt level: O1

bool __thiscall
DIS::AcknowledgeReliablePdu::operator==(AcknowledgeReliablePdu *this,AcknowledgeReliablePdu *rhs)

{
  bool bVar1;
  
  bVar1 = SimulationManagementWithReliabilityFamilyPdu::operator==
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                     &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  return (bVar1 && this->_acknowledgeFlag == rhs->_acknowledgeFlag) &&
         (this->_requestID == rhs->_requestID && this->_responseFlag == rhs->_responseFlag);
}

Assistant:

bool AcknowledgeReliablePdu::operator ==(const AcknowledgeReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_acknowledgeFlag == rhs._acknowledgeFlag) ) ivarsEqual = false;
     if( ! (_responseFlag == rhs._responseFlag) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }